

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Node * __thiscall JSON::Parser::parseNode(Node *__return_storage_ptr__,Parser *this)

{
  string *this_00;
  TokenType TVar1;
  int iVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  _Alloc_hider _Var6;
  string tokenValue;
  undefined1 local_288 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined8 local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_220;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_48;
  
  (__return_storage_ptr__->type)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->type).field_2
  ;
  (__return_storage_ptr__->type)._M_string_length = 0;
  (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
  this_00 = &__return_storage_ptr__->rawValue;
  (__return_storage_ptr__->rawValue)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->rawValue).field_2;
  (__return_storage_ptr__->rawValue)._M_string_length = 0;
  (__return_storage_ptr__->rawValue).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar1 = (this->currentToken).type;
  iVar2 = (this->currentToken).start;
  if ((int)TVar1 < 0x2f) {
    if (TVar1 == STRING) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,NodeType::StringLiteral_abi_cxx11_,
                 DAT_0010e390 + NodeType::StringLiteral_abi_cxx11_);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      pcVar3 = (this->currentToken).value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar3,pcVar3 + (this->currentToken).value._M_string_length);
      Node::Node((Node *)&local_268,&local_68,&local_128,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)local_268._M_local_buf);
      __return_storage_ptr__->start = (undefined4)local_248;
      __return_storage_ptr__->end = local_248._4_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_240._M_local_buf);
      local_288._16_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_288._0_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_288._8_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_288);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_allocated_capacity != &local_230) {
        operator_delete((void *)local_240._M_allocated_capacity,local_230._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &local_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        (ulong)(local_258._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      _Var6._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_00104946:
        operator_delete(_Var6._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (TVar1 != NUMBER) {
LAB_00104c62:
        unexpected(this,&this->currentToken);
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,NodeType::NumericLiteral_abi_cxx11_,
                 DAT_0010e3b0 + NodeType::NumericLiteral_abi_cxx11_);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pcVar3 = (this->currentToken).value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar3,pcVar3 + (this->currentToken).value._M_string_length);
      Node::Node((Node *)&local_268,&local_88,&local_148,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)local_268._M_local_buf);
      __return_storage_ptr__->start = (undefined4)local_248;
      __return_storage_ptr__->end = local_248._4_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_240._M_local_buf);
      local_288._16_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_288._0_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_288._8_8_ =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_288);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_allocated_capacity != &local_230) {
        operator_delete((void *)local_240._M_allocated_capacity,local_230._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &local_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        (ulong)(local_258._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_68.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
      _Var6._M_p = local_88._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_00104946;
    }
    next(this);
    goto LAB_00104c42;
  }
  if (TVar1 == WORD) {
    local_288._0_8_ = local_288 + 0x10;
    pcVar3 = (this->currentToken).value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,pcVar3,pcVar3 + (this->currentToken).value._M_string_length);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_288._0_8_,
               local_288._0_8_ + (long)(string *)local_288._8_8_);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"null","");
    bVar4 = stringEquals(&local_168,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,NodeType::NullLiteral_abi_cxx11_,
                 DAT_0010e3f0 + NodeType::NullLiteral_abi_cxx11_);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,local_288._0_8_,
                 local_288._0_8_ + (long)(string *)local_288._8_8_);
      Node::Node((Node *)&local_268,&local_c8,&local_188,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)local_268._M_local_buf);
      __return_storage_ptr__->start = (undefined4)local_248;
      __return_storage_ptr__->end = local_248._4_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_240._M_local_buf);
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_48);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_allocated_capacity != &local_230) {
        operator_delete((void *)local_240._M_allocated_capacity,local_230._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &local_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        (ulong)(local_258._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      local_108.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
      _Var6._M_p = local_c8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
LAB_00104c16:
        operator_delete(_Var6._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_288._0_8_,
                 local_288._0_8_ + (long)(string *)local_288._8_8_);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"true","");
      bVar4 = stringEquals(&local_1a8,&local_1c8);
      bVar5 = true;
      if (!bVar4) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_288._0_8_,
                   local_288._0_8_ + (long)(string *)local_288._8_8_);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"false","");
        bVar5 = stringEquals(&local_1e8,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if (bVar5 == false) {
        unexpected(this,&this->currentToken);
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,NodeType::BooleanLiteral_abi_cxx11_,
                 DAT_0010e3d0 + NodeType::BooleanLiteral_abi_cxx11_);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_288._0_8_,
                 local_288._0_8_ + (long)(string *)local_288._8_8_);
      Node::Node((Node *)&local_268,&local_108,&local_208,(this->currentToken).start,
                 (this->currentToken).end);
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)local_268._M_local_buf);
      __return_storage_ptr__->start = (undefined4)local_248;
      __return_storage_ptr__->end = local_248._4_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_240._M_local_buf);
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (__return_storage_ptr__->children).
           super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_48);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_allocated_capacity != &local_230) {
        operator_delete((void *)local_240._M_allocated_capacity,local_230._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_allocated_capacity != &local_258) {
        operator_delete((void *)local_268._M_allocated_capacity,
                        (ulong)(local_258._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      _Var6._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_00104c16;
    }
    next(this);
    local_258._M_allocated_capacity = local_288._16_8_;
    local_268._M_allocated_capacity = local_288._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_288 + 0x10)) goto LAB_00104c42;
  }
  else {
    if (TVar1 == BRACKETS_START) {
      parseArrayExpression((Node *)&local_268,this);
    }
    else {
      if (TVar1 != BRACES_START) goto LAB_00104c62;
      parseObjectExpression((Node *)&local_268,this);
    }
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)local_268._M_local_buf);
    __return_storage_ptr__->start = (undefined4)local_248;
    __return_storage_ptr__->end = local_248._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_240._M_local_buf);
    local_288._16_8_ =
         (__return_storage_ptr__->children).
         super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage;
    (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_288._0_8_ =
         (__return_storage_ptr__->children).
         super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.super__Vector_impl_data
         ._M_start;
    local_288._8_8_ =
         (__return_storage_ptr__->children).
         super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->children).super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_220.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
              ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_288);
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_allocated_capacity != &local_230) {
      operator_delete((void *)local_240._M_allocated_capacity,local_230._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_allocated_capacity == &local_258) goto LAB_00104c42;
  }
  operator_delete((void *)local_268._M_allocated_capacity,
                  (ulong)((long)&(((pointer)local_258._M_allocated_capacity)->type)._M_dataplus._M_p
                         + 1));
LAB_00104c42:
  __return_storage_ptr__->start = iVar2;
  __return_storage_ptr__->end = (this->lastToken).end;
  return __return_storage_ptr__;
}

Assistant:

Node Parser::parseNode() {
        Node node;
        int startPos = currentToken.start;
        TokenType type = currentToken.type;

        if (type == BRACES_START) {
            node = parseObjectExpression();
        } else if (type == BRACKETS_START) {
            node = parseArrayExpression();
        } else if (type == STRING) {
            node = Node(NodeType::StringLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == NUMBER) {
            node = Node(NodeType::NumericLiteral, currentToken.value, currentToken.start, currentToken.end);
            next();
        } else if (type == WORD) {
            string tokenValue = currentToken.value;
            if (stringEquals(tokenValue, "null")) {
                node = Node(NodeType::NullLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else if (stringEquals(tokenValue, "true") || stringEquals(tokenValue, "false")) {
                node = Node(NodeType::BooleanLiteral, tokenValue, currentToken.start, currentToken.end);
                next();
            } else {
                unexpected(currentToken);
            }
        } else {
            unexpected(currentToken);
        }

        node.start = startPos;
        node.end = lastToken.end;

        return node;
    }